

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineShaderStageModuleIdentifierCreateInfoEXT *create_info,
          ScratchAllocator *alloc)

{
  uint *puVar1;
  uchar *puVar2;
  uint local_2c;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *local_28;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *identifier;
  ScratchAllocator *alloc_local;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *create_info_local;
  Impl *this_local;
  
  identifier = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)alloc;
  alloc_local = (ScratchAllocator *)create_info;
  create_info_local = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)this;
  local_28 = copy<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(this,create_info,1,alloc);
  local_2c = 0x20;
  puVar1 = std::min<unsigned_int>(&local_28->identifierSize,&local_2c);
  local_28->identifierSize = *puVar1;
  puVar2 = copy<unsigned_char>(this,local_28->pIdentifier,(ulong)local_28->identifierSize,
                               (ScratchAllocator *)identifier);
  local_28->pIdentifier = puVar2;
  return local_28;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc)
{
	auto *identifier = copy(create_info, 1, alloc);
	// Safeguard since we'll be copying these to stack variables later.
	identifier->identifierSize =
			std::min<uint32_t>(identifier->identifierSize, VK_MAX_SHADER_MODULE_IDENTIFIER_SIZE_EXT);
	identifier->pIdentifier = copy(identifier->pIdentifier, identifier->identifierSize, alloc);
	return identifier;
}